

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

void vkt::image::anon_unknown_0::commandCopyImageToBuffer
               (Context *context,VkCommandBuffer cmdBuffer,VkImage image,VkBuffer buffer,
               VkDeviceSize bufferSizeBytes,Texture *texture)

{
  VkImageSubresourceRange subresourceRange;
  deUint32 layerCount;
  DeviceInterface *pDVar1;
  undefined1 local_130 [8];
  VkBufferMemoryBarrier copyBarrier;
  VkBufferImageCopy copyRegion;
  undefined1 local_a0 [8];
  VkImageMemoryBarrier prepareForTransferBarrier;
  undefined4 uStack_50;
  VkImageSubresourceRange fullImageSubresourceRange;
  DeviceInterface *vk;
  Texture *texture_local;
  VkDeviceSize bufferSizeBytes_local;
  VkCommandBuffer cmdBuffer_local;
  Context *context_local;
  VkBuffer buffer_local;
  VkImage image_local;
  
  pDVar1 = Context::getDeviceInterface(context);
  layerCount = Texture::numLayers(texture);
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)&prepareForTransferBarrier.field_0x44,1,0,1,0,layerCount);
  subresourceRange.levelCount = fullImageSubresourceRange.aspectMask;
  subresourceRange.aspectMask = prepareForTransferBarrier._68_4_;
  subresourceRange.baseMipLevel = uStack_50;
  subresourceRange.baseArrayLayer = fullImageSubresourceRange.baseMipLevel;
  subresourceRange.layerCount = fullImageSubresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_a0,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,image,subresourceRange);
  makeBufferImageCopy((VkBufferImageCopy *)&copyBarrier.size,texture);
  makeBufferMemoryBarrier((VkBufferMemoryBarrier *)local_130,0x1000,0x2000,buffer,0,bufferSizeBytes)
  ;
  (*pDVar1->_vptr_DeviceInterface[0x6d])(pDVar1,cmdBuffer,0x800,0x1000,0,0,0,0,0,1,local_a0);
  (*pDVar1->_vptr_DeviceInterface[99])
            (pDVar1,cmdBuffer,image.m_internal,6,buffer.m_internal,1,&copyBarrier.size);
  (*pDVar1->_vptr_DeviceInterface[0x6d])(pDVar1,cmdBuffer,0x1000,0x4000,0,0,0,1,(int)local_130,0,0);
  return;
}

Assistant:

void commandCopyImageToBuffer (Context&					context,
							   const VkCommandBuffer	cmdBuffer,
							   const VkImage			image,
							   const VkBuffer			buffer,
							   const VkDeviceSize		bufferSizeBytes,
							   const Texture&			texture)
{
	const DeviceInterface& vk = context.getDeviceInterface();

	const VkImageSubresourceRange fullImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, texture.numLayers());
	const VkImageMemoryBarrier prepareForTransferBarrier = makeImageMemoryBarrier(
		VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
		VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
		image, fullImageSubresourceRange);

	const VkBufferImageCopy copyRegion = makeBufferImageCopy(texture);

	const VkBufferMemoryBarrier copyBarrier = makeBufferMemoryBarrier(
		VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT,
		buffer, 0ull, bufferSizeBytes);

	vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &prepareForTransferBarrier);
	vk.cmdCopyImageToBuffer(cmdBuffer, image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, buffer, 1u, &copyRegion);
	vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &copyBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);
}